

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Instruction.cpp
# Opt level: O2

void Instruction::load(string *filename)

{
  int size;
  istream *piVar1;
  long lVar2;
  unsigned_long addr;
  Instruction *pIVar3;
  string text;
  string tmp;
  string line;
  ifstream input;
  
  std::ifstream::ifstream(&input,(string *)filename,_S_in);
  line._M_dataplus._M_p = (pointer)&line.field_2;
  line._M_string_length = 0;
  line.field_2._M_local_buf[0] = '\0';
  while( true ) {
    piVar1 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)&input,(string *)&line);
    if (((byte)piVar1[*(long *)(*(long *)piVar1 + -0x18) + 0x20] & 5) != 0) break;
    lVar2 = std::__cxx11::string::find((char)&line,0x3a);
    if (lVar2 != -1) {
      std::__cxx11::string::substr((ulong)&tmp,(ulong)&line);
      addr = std::__cxx11::stoul(&tmp,(size_t *)0x0,0x10);
      std::__cxx11::string::~string((string *)&tmp);
      if (addr != 0) {
        std::__cxx11::string::substr((ulong)&tmp,(ulong)&line);
        if (tmp._M_string_length != 0) {
          lVar2 = std::__cxx11::string::find((char)&tmp,0x3a);
          if (lVar2 != -1) {
            size = std::__cxx11::stoi(&tmp,(size_t *)0x0,10);
            if (0 < size) {
              std::__cxx11::string::substr((ulong)&text,(ulong)&tmp);
              if (text._M_string_length != 0) {
                pIVar3 = get(addr,size);
                std::__cxx11::string::_M_assign((string *)&pIVar3->m_text);
              }
              std::__cxx11::string::~string((string *)&text);
            }
          }
        }
        std::__cxx11::string::~string((string *)&tmp);
      }
    }
  }
  std::__cxx11::string::~string((string *)&line);
  std::ifstream::close();
  std::ifstream::~ifstream(&input);
  return;
}

Assistant:

void Instruction::load(std::string filename) {
	std::ifstream input(filename);

	for (std::string line; getline(input, line); ) {
		std::size_t n = line.find(':');
		if (n == std::string::npos)
			continue;

		Addr addr = std::stoul(line.substr(0, n), 0, 16);
		if (addr == 0)
			continue;

		std::string tmp = line.substr(n+1);
		if (tmp.empty())
			continue;

		n = tmp.find(':');
		if (n == std::string::npos)
			continue;

		int size = std::stoi(tmp);
		if (size <= 0)
			continue;

		std::string text = tmp.substr(n+1);
		if (text.empty())
			continue;

		Instruction* instr = Instruction::get(addr, size);
		instr->m_text = text;
	}

	input.close();
}